

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void add_new_tile(vector<Tile_*,_std::allocator<Tile_*>_> *tiles,Tile *tile)

{
  pointer *pppTVar1;
  iterator __position;
  Tile *local_8;
  
  __position._M_current =
       (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  tile->id = (uint16_t)
             ((uint)((int)__position._M_current -
                    *(int *)&(tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  if (__position._M_current ==
      (tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    local_8 = tile;
    std::vector<Tile*,std::allocator<Tile*>>::_M_realloc_insert<Tile*const&>
              ((vector<Tile*,std::allocator<Tile*>> *)tiles,__position,&local_8);
  }
  else {
    *__position._M_current = tile;
    pppTVar1 = &(tiles->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  return;
}

Assistant:

void add_new_tile(std::vector<Tile *> *tiles, Tile *tile) {
    tile->id = tiles->size();
    tiles->push_back(tile);
}